

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

int __thiscall gdsForge::GDSwriteBitArr(gdsForge *this,int record,bitset<16UL> inBits)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  uchar OHout [4];
  byte local_1e;
  byte local_1d;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined1 local_19;
  
  if ((char)record == '\x01') {
    local_1c = 0x600;
    local_1a = (undefined1)((uint)record >> 8);
    local_19 = 1;
    fwrite(&local_1c,1,4,(FILE *)this->gdsFile);
    local_1e = 0;
    uVar4 = 0xf;
    do {
      local_1e = local_1e |
                 (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar4 & 0x3f) & 1) != 0) <<
                 ((char)uVar4 - 8U & 0x1f);
      bVar1 = 8 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
    local_1d = 0;
    uVar4 = 8;
    do {
      local_1d = local_1d |
                 (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar4 & 0x3f) & 1) != 0) <<
                 ((byte)uVar4 & 0x1f);
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
    fwrite(&local_1e,1,2,(FILE *)this->gdsFile);
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Incorrect record: 0x",0x14);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,record);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int gdsForge::GDSwriteBitArr(int record, bitset<16> inBits)
{
  if ((record & 0xff) != 0x01) {
    cout << "Incorrect record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }
  unsigned char OHout[4];

  OHout[0] = 0 & 0xff;
  OHout[1] = (2 + 4) & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[2] = {0, 0};

  for (int i = 15; i >= 8; i--) {
    dataOut[0] = dataOut[0] | (inBits[i] << (i - 8));
  }
  for (int i = 8; i > 0; i--) {
    dataOut[1] = dataOut[1] | (inBits[i] << i);
  }

  fwrite(dataOut, 1, 2, this->gdsFile);

  return 0;
}